

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Encoding *encoding)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(*encoding) {
  case MFM:
    __s = "MFM";
    __a = &local_9;
    break;
  case FM:
    __s = "FM";
    __a = &local_a;
    break;
  case RX02:
    __s = "RX02";
    __a = &local_b;
    break;
  case Amiga:
    __s = "Amiga";
    __a = &local_c;
    break;
  case GCR:
    __s = "GCR";
    __a = &local_d;
    break;
  case Ace:
    __s = "Ace";
    __a = &local_e;
    break;
  case MX:
    __s = "MX";
    __a = &local_f;
    break;
  case Agat:
    __s = "Agat";
    __a = &local_10;
    break;
  case Apple:
    __s = "Apple";
    __a = &local_11;
    break;
  case Victor:
    __s = "Victor";
    __a = &local_12;
    break;
  case Vista:
    __s = "Vista";
    __a = &local_13;
    break;
  default:
    __s = "Unknown";
    __a = &local_14;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Encoding& encoding)
{
    switch (encoding)
    {
    case Encoding::MFM:     return "MFM";           break;
    case Encoding::FM:      return "FM";            break;
    case Encoding::RX02:    return "RX02";          break;
    case Encoding::Amiga:   return "Amiga";         break;
    case Encoding::GCR:     return "GCR";           break;
    case Encoding::Ace:     return "Ace";           break;
    case Encoding::MX:      return "MX";            break;
    case Encoding::Agat:    return "Agat";          break;
    case Encoding::Apple:   return "Apple";         break;
    case Encoding::Victor:  return "Victor";        break;
    case Encoding::Vista:   return "Vista";         break;
    case Encoding::Unknown: break;
    }
    return "Unknown";
}